

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  float *pfVar19;
  uint *puVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  float fVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  __m128 afVar29;
  unary_op_tanh op;
  unary_op_tanh local_71;
  Mat *local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  float local_48 [2];
  float afStack_40 [4];
  
  local_70 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86[-3])) {
  case 0:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      puVar20 = (uint *)(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        *puVar20 = *puVar20 & 0x7fffffff;
        puVar20[1] = puVar20[1] & 0x7fffffff;
        puVar20[2] = puVar20[2] & 0x7fffffff;
        puVar20[3] = puVar20[3] & 0x7fffffff;
        puVar20 = puVar20 + 4;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        *(uint *)((long)pvVar3 + lVar17 * 4 + lVar14) =
             *(uint *)((long)pvVar3 + lVar17 * 4 + lVar14) & 0x7fffffff;
      }
    }
    break;
  case 1:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      puVar20 = (uint *)(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        *puVar20 = *puVar20 ^ 0x80000000;
        puVar20[1] = puVar20[1] ^ 0x80000000;
        puVar20[2] = puVar20[2] ^ 0x80000000;
        puVar20[3] = puVar20[3] ^ 0x80000000;
        puVar20 = puVar20 + 4;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        *(uint *)((long)pvVar3 + lVar17 * 4 + lVar14) =
             *(uint *)((long)pvVar3 + lVar17 * 4 + lVar14) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_floor::func_pack4
                            ((unary_op_floor *)&local_71,(__m128 *)local_48);
        auVar13._8_4_ = extraout_XMM0_Dc_04;
        auVar13._0_8_ = afVar29._0_8_;
        auVar13._12_4_ = extraout_XMM0_Dd_04;
        *pauVar21 = auVar13;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = floorf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 3:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_ceil::func_pack4
                            ((unary_op_ceil *)&local_71,(__m128 *)local_48);
        auVar12._8_4_ = extraout_XMM0_Dc_05;
        auVar12._0_8_ = afVar29._0_8_;
        auVar12._12_4_ = extraout_XMM0_Dd_05;
        *pauVar21 = auVar12;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = ceilf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 4:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pfVar19 = (float *)(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        *pfVar19 = *pfVar19 * *pfVar19;
        pfVar19[1] = pfVar19[1] * pfVar19[1];
        pfVar19[2] = pfVar19[2] * pfVar19[2];
        pfVar19[3] = pfVar19[3] * pfVar19[3];
        pfVar19 = pfVar19 + 4;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = *(float *)((long)pvVar3 + lVar17 * 4 + lVar14);
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23 * fVar23;
      }
    }
    break;
  case 5:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [16])(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        auVar24 = *pauVar21;
        auVar25 = rsqrtps(in_XMM5,auVar24);
        fVar23 = auVar24._0_4_ * auVar25._0_4_;
        fVar26 = auVar24._4_4_ * auVar25._4_4_;
        fVar27 = auVar24._8_4_ * auVar25._8_4_;
        fVar28 = auVar24._12_4_ * auVar25._12_4_;
        in_XMM5._0_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar24._0_4_)) &
             (uint)((fVar23 * auVar25._0_4_ + -3.0) * fVar23 * -0.5);
        in_XMM5._4_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar24._4_4_)) &
             (uint)((fVar26 * auVar25._4_4_ + -3.0) * fVar26 * -0.5);
        in_XMM5._8_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar24._8_4_)) &
             (uint)((fVar27 * auVar25._8_4_ + -3.0) * fVar27 * -0.5);
        in_XMM5._12_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar24._12_4_)) &
             (uint)((fVar28 * auVar25._12_4_ + -3.0) * fVar28 * -0.5);
        *pauVar21 = in_XMM5;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) =
             SQRT(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
      }
    }
    break;
  case 6:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [16])(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        in_XMM2 = rsqrtps(in_XMM2,*pauVar21);
        *pauVar21 = in_XMM2;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = *(float *)((long)pvVar3 + lVar17 * 4 + lVar14);
        auVar24 = rsqrtss(in_XMM3,ZEXT416((uint)fVar23));
        fVar26 = auVar24._0_4_;
        fVar23 = fVar23 * fVar26 * fVar26 + -3.0;
        in_XMM2 = ZEXT416((uint)fVar23);
        in_XMM3._4_12_ = auVar24._4_12_;
        in_XMM3._0_4_ = fVar26 * -0.5 * fVar23;
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = in_XMM3._0_4_;
      }
    }
    break;
  case 7:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_71,(__m128 *)local_48);
        auVar11._8_4_ = extraout_XMM0_Dc_06;
        auVar11._0_8_ = afVar29._0_8_;
        auVar11._12_4_ = extraout_XMM0_Dd_06;
        *pauVar21 = auVar11;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = expf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 8:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_71,(__m128 *)local_48);
        auVar10._8_4_ = extraout_XMM0_Dc_10;
        auVar10._0_8_ = afVar29._0_8_;
        auVar10._12_4_ = extraout_XMM0_Dd_10;
        *pauVar21 = auVar10;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = logf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 9:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_71,(__m128 *)local_48);
        auVar9._8_4_ = extraout_XMM0_Dc_03;
        auVar9._0_8_ = afVar29._0_8_;
        auVar9._12_4_ = extraout_XMM0_Dd_03;
        *pauVar21 = auVar9;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = sinf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 10:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_71,(__m128 *)local_48);
        auVar8._8_4_ = extraout_XMM0_Dc_09;
        auVar8._0_8_ = afVar29._0_8_;
        auVar8._12_4_ = extraout_XMM0_Dd_09;
        *pauVar21 = auVar8;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = cosf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0xb:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_71,(__m128 *)local_48);
        auVar7._8_4_ = extraout_XMM0_Dc_01;
        auVar7._0_8_ = afVar29._0_8_;
        auVar7._12_4_ = extraout_XMM0_Dd_01;
        *pauVar21 = auVar7;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = tanf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0xc:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_71,(__m128 *)local_48);
        auVar6._8_4_ = extraout_XMM0_Dc_02;
        auVar6._0_8_ = afVar29._0_8_;
        auVar6._12_4_ = extraout_XMM0_Dd_02;
        *pauVar21 = auVar6;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = asinf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0xd:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_71,(__m128 *)local_48);
        auVar5._8_4_ = extraout_XMM0_Dc_08;
        auVar5._0_8_ = afVar29._0_8_;
        auVar5._12_4_ = extraout_XMM0_Dd_08;
        *pauVar21 = auVar5;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = acosf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0xe:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_71,(__m128 *)local_48);
        auVar4._8_4_ = extraout_XMM0_Dc_00;
        auVar4._0_8_ = afVar29._0_8_;
        auVar4._12_4_ = extraout_XMM0_Dd_00;
        *pauVar21 = auVar4;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = atanf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0xf:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar16 = 0;
    uVar15 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar15 = uVar16;
    }
    for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [16])(sVar2 * uVar16 * sVar1 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        auVar24 = *pauVar21;
        in_XMM3 = rcpps(in_XMM3,auVar24);
        fVar23 = in_XMM3._0_4_;
        fVar26 = in_XMM3._4_4_;
        fVar27 = in_XMM3._8_4_;
        fVar28 = in_XMM3._12_4_;
        *(float *)*pauVar21 = (1.0 - auVar24._0_4_ * fVar23) * fVar23 + fVar23;
        *(float *)(*pauVar21 + 4) = (1.0 - auVar24._4_4_ * fVar26) * fVar26 + fVar26;
        *(float *)(*pauVar21 + 8) = (1.0 - auVar24._8_4_ * fVar27) * fVar27 + fVar27;
        *(float *)(*pauVar21 + 0xc) = (1.0 - auVar24._12_4_ * fVar28) * fVar28 + fVar28;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = sVar2 * sVar1 * uVar16;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) =
             1.0 / *(float *)((long)pvVar3 + lVar17 * 4 + lVar14);
      }
    }
    break;
  case 0x10:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_tanh::func_pack4(&local_71,(__m128 *)local_48);
        auVar25._8_4_ = extraout_XMM0_Dc;
        auVar25._0_8_ = afVar29._0_8_;
        auVar25._12_4_ = extraout_XMM0_Dd;
        *pauVar21 = auVar25;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = tanhf(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
    break;
  case 0x11:
    iVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar3 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar21 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar3);
      lVar17 = 0;
      for (iVar22 = 0; uVar15 = local_50, iVar22 + 3 < iVar18; iVar22 = iVar22 + 4) {
        local_48 = *(float (*) [2])*pauVar21;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar21 + 8);
        afVar29 = UnaryOp_x86_functor::unary_op_log10::func_pack4
                            ((unary_op_log10 *)&local_71,(__m128 *)local_48);
        auVar24._8_4_ = extraout_XMM0_Dc_07;
        auVar24._0_8_ = afVar29._0_8_;
        auVar24._12_4_ = extraout_XMM0_Dd_07;
        *pauVar21 = auVar24;
        pauVar21 = pauVar21 + 1;
        lVar17 = lVar17 + 4;
      }
      lVar14 = local_58 * local_60 * local_50;
      for (; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar23 = log10f(*(float *)((long)pvVar3 + lVar17 * 4 + lVar14));
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar14) = fVar23;
      }
      local_50 = uVar15 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}